

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall CGL::HalfedgeMesh::HalfedgeMesh(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl._M_node.
  _M_size = 0;
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->vertices;
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->vertices;
  (this->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  _M_size = 0;
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->edges;
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->edges;
  (this->edges).super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node._M_size = 0;
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->faces;
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->faces;
  (this->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node._M_size = 0;
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->boundaries;
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->boundaries;
  (this->boundaries).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node._M_size
       = 0;
  operator=(this,mesh);
  return;
}

Assistant:

HalfedgeMesh::HalfedgeMesh(const HalfedgeMesh& mesh) { *this = mesh; }